

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

void __thiscall
CVmObjGramProd::enqueue_alts
          (CVmObjGramProd *this,CVmGramProdMem *mem,vmgramprod_tok *tok,size_t tok_cnt,
          size_t start_tok_pos,CVmGramProdState *enclosing_state,CVmGramProdQueue *queues,
          vm_obj_id_t self,int circ_only,CVmGramProdMatch *circ_match,CVmObjDict *dict)

{
  vm_prop_id_t vVar1;
  uint uVar2;
  vm_obj_id_t vVar3;
  vm_prop_id_t *pvVar4;
  long lVar5;
  vmgram_alt_info *altp;
  int iVar6;
  char *pcVar7;
  CVmGramProdState *pCVar8;
  CVmGramProdMatch *pCVar9;
  byte bVar10;
  long lVar11;
  size_t cur_alt_tok;
  long lVar12;
  size_t sVar13;
  vm_prop_id_t *pvVar14;
  vm_prop_id_t *pvVar15;
  CVmGramProdMatch **ppCVar16;
  long *plVar17;
  size_t sVar18;
  bool bVar19;
  bool bVar20;
  vm_val_t match_result;
  int local_7c;
  CVmGramProdMatch **local_78;
  size_t sStack_70;
  CVmGramProdMem *local_60;
  ulong local_58;
  size_t local_50;
  CVmGramProdState *local_48;
  vm_val_t local_40;
  
  local_7c = circ_only;
  pcVar7 = (this->super_CVmObject).ext_;
  uVar2 = *(uint *)(pcVar7 + 0x14);
  if (dict == (CVmObjDict *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *(int *)((dict->super_CVmObject).ext_ + 0x20);
  }
  local_60 = mem;
  local_50 = start_tok_pos;
  local_48 = enclosing_state;
  if (((uVar2 & 2) == 0) || (*(int *)(pcVar7 + 0x10) != iVar6)) {
    cache_hashes(this,dict);
    pcVar7 = (this->super_CVmObject).ext_;
  }
  ppCVar16 = *(CVmGramProdMatch ***)(pcVar7 + 0x38);
  if (ppCVar16 == (CVmGramProdMatch **)0x0) {
    return;
  }
  plVar17 = *(long **)(pcVar7 + 0x30);
LAB_00292e72:
  pvVar4 = *(vm_prop_id_t **)(*plVar17 + 0x10);
  lVar5 = *(long *)(*plVar17 + 0x18);
  if (lVar5 != 0) {
    bVar20 = false;
    local_58 = 0;
    if ((char)pvVar4[1] == '\x01') {
      local_58 = (ulong)CONCAT31((int3)(self >> 8),*(vm_obj_id_t *)(pvVar4 + 4) == self);
    }
    lVar12 = 0;
    pvVar15 = pvVar4;
    sVar18 = local_50;
    local_78 = ppCVar16;
LAB_00292ec0:
    do {
      switch((char)pvVar15[1]) {
      case '\x01':
        if (lVar12 != 0) {
          bVar20 = true;
        }
        if (circ_only == 0) {
          bVar20 = true;
        }
        if ((char)local_58 == '\0') {
          bVar20 = true;
        }
        goto LAB_00293013;
      case '\x02':
        if ((sVar18 < tok_cnt) && (tok[sVar18].match_cnt_ != 0)) {
          sVar13 = 0;
          do {
            if (tok[sVar18].matches_[sVar13].prop == pvVar15[4]) goto LAB_00292ffb;
            sVar13 = sVar13 + 1;
          } while (tok[sVar18].match_cnt_ != sVar13);
        }
        break;
      case '\x03':
        if (((tok_cnt <= sVar18) || (tok[sVar18].txt_ == (char *)0x0)) ||
           (*(uint *)(pvVar15 + 0xc) != tok[sVar18].hash_)) break;
        iVar6 = tok_equals_lit(tok + sVar18,*(char **)(pvVar15 + 4),*(size_t *)(pvVar15 + 8),dict,
                               &local_40);
        bVar19 = iVar6 != 0;
        goto LAB_00292fe6;
      case '\x04':
        if (sVar18 < tok_cnt) {
          bVar19 = tok[sVar18].typ_ == (ulong)*(uint *)(pvVar15 + 4);
          goto LAB_00292fe6;
        }
        break;
      case '\x05':
        bVar10 = 0;
        sVar18 = tok_cnt;
        goto LAB_00293005;
      case '\x06':
        if ((sVar18 < tok_cnt) && (lVar11 = *(long *)(pvVar15 + 4), lVar11 != 0)) {
          pvVar14 = *(vm_prop_id_t **)(pvVar15 + 8);
          do {
            if (tok[sVar18].match_cnt_ != 0) {
              sVar13 = 0;
              do {
                if (tok[sVar18].matches_[sVar13].prop == *pvVar14) goto LAB_00292ffb;
                sVar13 = sVar13 + 1;
              } while (tok[sVar18].match_cnt_ != sVar13);
            }
            pvVar14 = pvVar14 + 1;
            bVar19 = false;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
          goto LAB_00292fe6;
        }
      }
      bVar19 = false;
LAB_00292fe6:
      ppCVar16 = local_78;
      if ((bVar19) || (!bVar20)) {
        bVar10 = 1;
        if (bVar19) goto LAB_00293005;
        goto LAB_0029315f;
      }
      if (tok_cnt <= sVar18) goto LAB_0029315f;
      sVar18 = sVar18 + 1;
    } while( true );
  }
  if (circ_only == 0) goto LAB_0029308c;
  goto LAB_0029315f;
LAB_00292ffb:
  bVar10 = 1;
LAB_00293005:
  sVar18 = sVar18 + (sVar18 < tok_cnt & bVar10);
LAB_00293013:
  lVar12 = lVar12 + 1;
  pvVar15 = pvVar15 + 0x10;
  if (lVar12 == lVar5) goto LAB_0029306d;
  goto LAB_00292ec0;
LAB_0029306d:
  ppCVar16 = local_78;
  if ((circ_only == 0) != (bool)(char)local_58) {
LAB_0029308c:
    altp = (vmgram_alt_info *)*plVar17;
    pCVar8 = create_new_state(local_60,local_50,local_48,altp,self,&local_7c,uVar2 >> 2 & 1);
    bVar20 = altp->badness != 0;
    pCVar8->nxt_ = (&queues->work_queue_)[bVar20];
    (&queues->work_queue_)[bVar20] = pCVar8;
    if (circ_only != 0) {
      vVar1 = *pvVar4;
      vVar3 = circ_match->proc_obj_;
      local_78 = circ_match->sub_match_list_;
      sStack_70 = circ_match->sub_match_cnt_;
      pCVar9 = (CVmGramProdMatch *)CVmGramProdMem::alloc(local_60,0x38);
      pCVar9->tok_pos_ = 0;
      pCVar9->matched_star_ = 0;
      pCVar9->target_prop_ = vVar1;
      pCVar9->proc_obj_ = vVar3;
      pCVar9->sub_match_list_ = local_78;
      pCVar9->sub_match_cnt_ = sStack_70;
      (pCVar9->tok_match_result_).typ = VM_NIL;
      pCVar8->match_list_[0] = pCVar9;
      pCVar8->alt_pos_ = 1;
    }
  }
LAB_0029315f:
  plVar17 = plVar17 + 1;
  ppCVar16 = (CVmGramProdMatch **)((long)ppCVar16 + -1);
  if (ppCVar16 == (CVmGramProdMatch **)0x0) {
    return;
  }
  goto LAB_00292e72;
}

Assistant:

void CVmObjGramProd::enqueue_alts(VMG_ CVmGramProdMem *mem,
                                  const vmgramprod_tok *tok,
                                  size_t tok_cnt, size_t start_tok_pos,
                                  CVmGramProdState *enclosing_state,
                                  CVmGramProdQueue *queues, vm_obj_id_t self,
                                  int circ_only,
                                  CVmGramProdMatch *circ_match,
                                  CVmObjDict *dict)
{
    vmgram_alt_info *const *altp;
    size_t i;
    int need_to_clone;
    int has_circ;
    vm_obj_id_t comparator;

    /* 
     *   We don't need to clone the enclosing state until we've set up one
     *   new state referring back to it.  However, if we're doing circular
     *   alternatives, the enclosing state could also be enqueued
     *   separately as its own state, so do clone all required copies in
     *   this case.  
     */
    need_to_clone = circ_only;

    /* note whether or not we have any circular alternatives */
    has_circ = get_ext()->has_circular_alt;

    /* 
     *   Cache hash values for all of our literals.  We need to do this if we
     *   haven't done it before, or if the comparator associated with the
     *   dictionary is different than it was last time we cached the values. 
     */
    comparator = (dict != 0 ? dict->get_comparator() : VM_INVALID_OBJ);
    if (!get_ext()->hashes_cached_ || get_ext()->comparator_ != comparator)
        cache_hashes(vmg_ dict);

    /* 
     *   run through our alternatives and enqueue each one that looks
     *   plausible 
     */
    for (altp = get_ext()->alts_, i = get_ext()->alt_cnt_ ; i != 0 ;
         --i, ++altp)
    {
        /* start at the first token remaining in the string */
        size_t tok_idx = start_tok_pos;

        /* get the first token for this alternative */
        vmgram_tok_info *first_tokp = (*altp)->toks;

        /* start at the first token */
        vmgram_tok_info *tokp = first_tokp;

        /* get the number of tokens in the alternative */
        size_t alt_tok_cnt = (*altp)->tok_cnt;
        
        /* presume we will find no mismatches in this check */
        int found_mismatch = FALSE;

        /* 
         *   note whether this alternative is a direct circular reference
         *   or not (it is directly circular if the first token points
         *   back to this same production) 
         */
        int is_circ = (alt_tok_cnt != 0
                       && tokp->typ == VMGRAM_MATCH_PROD
                       && tokp->typinfo.prod_obj == self);
        
        /* 
         *   we don't have a production before the current item (this is
         *   important because it determines whether we must consider the
         *   current token or any following token when trying to match a
         *   literal, part of speech, or token type) 
         */
        int prod_before = FALSE;

        /* scan the tokens in the alternative */
        for (size_t cur_alt_tok = 0 ; cur_alt_tok < alt_tok_cnt ;
             ++cur_alt_tok, ++tokp)
        {
            int match;
            int match_star;
            int ignore_item;
            vm_val_t match_result;

            /* presume we won't find a match */
            match = FALSE;
            match_star = FALSE;

            /* presume we won't be able to ignore the item */
            ignore_item = FALSE;

            /* 
             *   Try to find a match to the current alternative item.  If
             *   we've already found a mismatch, don't bother, since we need
             *   no further evidence to skip this alternative; in this case
             *   we're still looping over the alternative items simply to
             *   find the beginning of the next alternative.  
             */
            for ( ; !found_mismatch ; ++tok_idx)
            {
                /* see what kind of item we have */
                switch(tokp->typ)
                {
                case VMGRAM_MATCH_PROD:
                    /* 
                     *   We can't rule out a production without checking
                     *   it fully, which we're not doing on this pass;
                     *   however, note that we found a production, because
                     *   it means that we must from now on try skipping
                     *   any number of tokens before ruling out a match on
                     *   other grounds, since the production could
                     *   potentially match any number of tokens.
                     *   
                     *   If we're doing circular matches only, and this is
                     *   a circular production, and we're on the first
                     *   token in our list, we already know it matches, so
                     *   don't even count it as a production before the
                     *   item.  
                     */
                    if (is_circ && circ_only && cur_alt_tok == 0)
                    {
                        /* 
                         *   ignore the fact that it's a production, since
                         *   we already know it matches - we don't want to
                         *   be flexible about tokens following this item
                         *   since we know the exact number that match it 
                         */
                    }
                    else
                    {
                        /* note the production item */
                        prod_before = TRUE;
                    }

                    /* 
                     *   we can ignore this item for the purposes of
                     *   detecting a mismatch, because we can't tell
                     *   during this superficial scan whether it matches 
                     */
                    ignore_item = TRUE;
                    break;
                
                case VMGRAM_MATCH_SPEECH:
                    /* we must match a part of speech */
                    if (tok_idx < tok_cnt
                        && find_prop_in_tok(&tok[tok_idx],
                                            tokp->typinfo.speech_prop))
                    {
                        /* it's a match */
                        match = TRUE;
                    }
                    break;

                case VMGRAM_MATCH_NSPEECH:
                    /* multiple parts of speech */
                    if (tok_idx < tok_cnt)
                    {
                        vm_prop_id_t *prop;
                        size_t rem;

                        /* presume we won't find a match */
                        match = FALSE;

                        /* check each item in the list */
                        for (prop = tokp->typinfo.nspeech.props,
                             rem = tokp->typinfo.nspeech.cnt ; rem != 0 ;
                             --rem, ++prop)
                        {
                            /* if this one matches, we have a match */
                            if (find_prop_in_tok(&tok[tok_idx], *prop))
                            {
                                /* note the match */
                                match = TRUE;

                                /* no need to look any further */
                                break;
                            }
                        }
                    }
                    else
                    {
                        /* we're out of tokens, so we have no match */
                        match = FALSE;
                    }
                    break;
                    
                case VMGRAM_MATCH_LITERAL:
                    /* 
                     *   Match a literal.  Compare the hash values first,
                     *   since a negative match on the hash values will tell
                     *   us for sure that the text won't match; since not
                     *   matching is by far the most common case, this saves
                     *   us the work of doing full string comparisons most of
                     *   the time. 
                     */
                    if (tok_idx < tok_cnt
                        && tok[tok_idx].txt_ != 0
                        && tokp->typinfo.lit.hash == tok[tok_idx].hash_
                        && tok_equals_lit(vmg_ &tok[tok_idx],
                                          tokp->typinfo.lit.str,
                                          tokp->typinfo.lit.len,
                                          dict, &match_result))
                    {
                        /* it's a match */
                        match = TRUE;
                    }
                    break;
                
                case VMGRAM_MATCH_TOKTYPE:
                    /* we must match a token type */
                    if (tok_idx < tok_cnt
                        && tok[tok_idx].typ_ == tokp->typinfo.toktyp_enum)
                        match = TRUE;
                    break;

                case VMGRAM_MATCH_STAR:
                    /* consume everything remaining on the line */
                    tok_idx = tok_cnt;

                    /* this is a match */
                    match = TRUE;
                    match_star = TRUE;
                    break;
                }

                /* if we found a match, we can stop scanning now */
                if (match)
                    break;

                /* 
                 *   we didn't match this token - if we have a production
                 *   before this point, we must keep scanning token, since
                 *   the production could end up matching any number of
                 *   tokens; if we don't have a production item, though,
                 *   we don't need to look any further, and we can rule
                 *   out this alternative immediately 
                 */
                if (!prod_before)
                    break;

                /* 
                 *   if we're ignoring this item (because we can't decide
                 *   now whether it's a match or not, and hence can't rule
                 *   it out), don't scan any tokens for the item 
                 */
                if (ignore_item)
                    break;

                /* 
                 *   if we didn't find a match, and we're out of tokens,
                 *   stop looking - we have no more tokens to look at to
                 *   find a match 
                 */
                if (!match && tok_idx >= tok_cnt)
                    break;
            }

            /* check to see if we found a match */
            if (match)
            {
                /* 
                 *   we found a match - skip the current token (unless we
                 *   matched a '*' item, in which case we've already
                 *   consumed all remaining tokens) 
                 */
                if (!match_star && tok_idx < tok_cnt)
                    ++tok_idx;
            }
            else if (!ignore_item)
            {
                /* 
                 *   we didn't match, and we can't ignore this item - note
                 *   that the alternative does not match 
                 */
                found_mismatch = TRUE;

                /* finish up with this alternative and proceed to the next */
                break;
            }
        }

        /* 
         *   If we didn't find a reason to rule out this alternative,
         *   enqueue the alternative.  Never enqueue circular references,
         *   unless we're ONLY enqueuing circular references.
         */
        if (!found_mismatch
            && ((!circ_only && !is_circ)
                || (circ_only && is_circ)))
        {
            CVmGramProdState *state;
            
            /* create and enqueue the new state */
            state = enqueue_new_state(mem, start_tok_pos, enclosing_state,
                                      *altp, self, &need_to_clone, queues,
                                      has_circ);

            /* 
             *   if we are enqueuing circular references, we already have
             *   a match for the first (circular) token, so fill it in 
             */
            if (circ_only)
            {
                CVmGramProdMatch *match;
                
                /* create a match for the alternative */
                match = CVmGramProdMatch::
                        alloc(mem, 0, 0, FALSE, first_tokp->prop,
                              circ_match->proc_obj_,
                              circ_match->sub_match_list_,
                              circ_match->sub_match_cnt_);

                /* set the first match in the token */
                state->match_list_[0] = match;

                /* set up at the second token */
                state->alt_pos_ = 1;
            }
        }
    }
}